

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall Net::closing(Net *this)

{
  string local_68 [55];
  allocator local_31;
  string local_30 [8];
  string request;
  Net *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"CLOSE",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string(local_68,local_30);
  send_with_retry(this,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  BIO_ctrl((BIO *)this->sock,0x8e,0,(void *)0x0);
  this->closed = 1;
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Net::closing(){
	std::string request="CLOSE";
	send_with_retry(request);
	BIO_shutdown_wr(sock);
	closed=1;
}